

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_expr2(JSParseState *s,int parse_flags)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  BOOL comma;
  JSParseState *in_stack_00000048;
  int in_stack_00000054;
  JSParseState *in_stack_00000058;
  undefined4 in_stack_fffffffffffffffc;
  
  bVar1 = false;
  while( true ) {
    iVar2 = js_parse_assign_expr2(in_stack_00000058,in_stack_00000054);
    if (iVar2 != 0) {
      return -1;
    }
    if (bVar1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x68) + 0x160) = 0xffffffff;
    }
    if (*(int *)(in_RDI + 0x18) != 0x2c) break;
    bVar1 = true;
    iVar2 = next_token(in_stack_00000048);
    if (iVar2 != 0) {
      return -1;
    }
    emit_op((JSParseState *)CONCAT44(parse_flags,comma),
            (uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18));
  }
  return 0;
}

Assistant:

static __exception int js_parse_expr2(JSParseState *s, int parse_flags)
{
    BOOL comma = FALSE;
    for(;;) {
        if (js_parse_assign_expr2(s, parse_flags))
            return -1;
        if (comma) {
            /* prevent get_lvalue from using the last expression
               as an lvalue. This also prevents the conversion of
               of get_var to get_ref for method lookup in function
               call inside `with` statement.
             */
            s->cur_func->last_opcode_pos = -1;
        }
        if (s->token.val != ',')
            break;
        comma = TRUE;
        if (next_token(s))
            return -1;
        emit_op(s, OP_drop);
    }
    return 0;
}